

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_NlsResidual_MassTDep(N_Vector zcor,N_Vector r,void *arkode_mem)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeARKStepMem *)0x11fbfe);
  if (local_4 == 0) {
    N_VLinearSum(0,*(undefined8 *)(in_stack_ffffffffffffffd0 + 0x48),in_RDI,
                 *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x228));
    N_VLinearSum(0,0xbff0000000000000,in_RDI,*(undefined8 *)(in_stack_ffffffffffffffd0 + 0x40),
                 *(undefined8 *)
                  (*(long *)(in_stack_ffffffffffffffd0 + 0x30) +
                  (long)*(int *)(in_stack_ffffffffffffffd0 + 0x60) * 8));
    iVar1 = (**(code **)(in_stack_ffffffffffffffd0 + 0x158))
                      (in_stack_ffffffffffffffd8,
                       *(undefined8 *)
                        (*(long *)(in_stack_ffffffffffffffd0 + 0x30) +
                        (long)*(int *)(in_stack_ffffffffffffffd0 + 0x60) * 8),in_RSI);
    if (iVar1 == 0) {
      iVar1 = (**(code **)(in_stack_ffffffffffffffd0 + 0x90))
                        ((int)*(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x2d0),
                         *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x228),
                         *(undefined8 *)
                          (*(long *)(in_stack_ffffffffffffffd0 + 0x30) +
                          (long)*(int *)(in_stack_ffffffffffffffd0 + 0x60) * 8),
                         *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x10));
      *(long *)(in_stack_ffffffffffffffd0 + 0x188) =
           *(long *)(in_stack_ffffffffffffffd0 + 0x188) + 1;
      if (iVar1 < 0) {
        local_4 = -8;
      }
      else if (iVar1 < 1) {
        N_VLinearSum(0,*(ulong *)(in_stack_ffffffffffffffd0 + 0x98) ^ 0x8000000000000000,in_RSI,
                     *(undefined8 *)
                      (*(long *)(in_stack_ffffffffffffffd0 + 0x30) +
                      (long)*(int *)(in_stack_ffffffffffffffd0 + 0x60) * 8),in_RSI);
        local_4 = 0;
      }
      else {
        local_4 = 9;
      }
    }
    else {
      local_4 = -0x12;
    }
  }
  return local_4;
}

Assistant:

int arkStep_NlsResidual_MassTDep(N_Vector zcor, N_Vector r, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* put M*(zcor - sdata) in r (use Fi[is] as temporary storage) */
  N_VLinearSum(ONE, zcor, -ONE, step_mem->sdata, step_mem->Fi[step_mem->istage]);
  retval = step_mem->mmult((void*)ark_mem, step_mem->Fi[step_mem->istage], r);
  if (retval != ARK_SUCCESS) { return (ARK_MASSMULT_FAIL); }

  /* compute implicit RHS */
  retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fi[step_mem->istage], ark_mem->user_data);
  step_mem->nfi++;
  if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
  if (retval > 0) { return (RHSFUNC_RECVR); }

  /* compute residual via linear sum */
  N_VLinearSum(ONE, r, -step_mem->gamma, step_mem->Fi[step_mem->istage], r);
  return (ARK_SUCCESS);
}